

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::parseAnnotation(Parser *this,Annotation *annotation)

{
  bool bVar1;
  StringDictionary *sourceDictionary;
  Value local_e8;
  char *local_98;
  undefined1 local_90 [8];
  Value value;
  undefined1 local_48 [8];
  string name;
  Annotation *annotation_local;
  Parser *this_local;
  
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)"[[");
  if (bVar1) {
    name.field_2._8_8_ = (long)" ]]" + 1;
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x54e281);
    if (!bVar1) {
      do {
        value.allocatedData.allocatedData.space[0] = (uint64_t)anon_var_dwarf_10edc7;
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)"$string literal");
        if (bVar1) {
          std::__cxx11::string::string
                    ((string *)local_48,
                     (string *)
                     &(this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ).currentStringValue);
        }
        else {
          readGeneralIdentifier_abi_cxx11_((string *)local_48,this);
        }
        local_98 = ":";
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x575e29);
        if (bVar1) {
          parseAnnotationValue((Value *)local_90,this);
        }
        else {
          soul::Value::Value((Value *)local_90,true);
        }
        soul::Value::Value(&local_e8,(Value *)local_90);
        sourceDictionary = Program::getStringDictionary(&this->program);
        Annotation::set(annotation,(string *)local_48,&local_e8,sourceDictionary);
        soul::Value::~Value(&local_e8);
        soul::Value::~Value((Value *)local_90);
        std::__cxx11::string::~string((string *)local_48);
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)",");
      } while (bVar1);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x54e281);
    }
  }
  return;
}

Assistant:

void parseAnnotation (Annotation& annotation)
    {
        if (matchIf (HEARTOperator::openDoubleBracket))
        {
            if (matchIf (HEARTOperator::closeDoubleBracket))
                return;

            do
            {
                auto name  = matchIf (Token::literalString) ? currentStringValue : readGeneralIdentifier();
                auto value = matchIf (HEARTOperator::colon) ? parseAnnotationValue() : Value (true);

                annotation.set (name, value, program.getStringDictionary());
            }
            while (matchIf (HEARTOperator::comma));

            expect (HEARTOperator::closeDoubleBracket);
        }
    }